

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_equals_Test<std::pair<char32_t,_char16_t>_>::UnicodeFullTest_equals_Test
          (UnicodeFullTest_equals_Test<std::pair<char32_t,_char16_t>_> *this)

{
  UnicodeFullTest_equals_Test<std::pair<char32_t,_char16_t>_> *this_local;
  
  UnicodeFullTest<std::pair<char32_t,_char16_t>_>::UnicodeFullTest
            (&this->super_UnicodeFullTest<std::pair<char32_t,_char16_t>_>);
  *(undefined ***)&this->super_UnicodeFullTest<std::pair<char32_t,_char16_t>_> =
       &PTR__UnicodeFullTest_equals_Test_00814be0;
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, equals) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}